

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O1

int Abc_CommandAbc9BCore(Abc_Frame_t *pAbc,int argc,char **argv)

{
  int iVar1;
  Abc_Frame_t *pAVar2;
  int iVar3;
  FILE *pFVar4;
  Bmc_BCorePar_t *pPars;
  char *pcVar5;
  Bmc_BCorePar_t Pars;
  Bmc_BCorePar_t local_68;
  Abc_Frame_t *local_38;
  
  local_68.pFilePivots = (char *)0x0;
  local_68.pFileProof = (char *)0x0;
  local_68.iFrame = 10;
  local_68.iOutput = 0;
  local_68._8_8_ = 0;
  local_68._32_8_ = 0;
  local_38 = pAbc;
  Extra_UtilGetoptReset();
  pcVar5 = "Command line switch \"-V\" should be followed by a file name.\n";
LAB_0028af7e:
  while (iVar3 = Extra_UtilGetopt(argc,argv,"FOTVvh"), pAVar2 = local_38, iVar1 = globalUtilOptind,
        iVar3 < 0x54) {
    if (iVar3 != 0x46) {
      if (iVar3 == 0x4f) {
        if (globalUtilOptind < argc) {
          iVar3 = atoi(argv[globalUtilOptind]);
          local_68.iOutput = iVar3;
          goto LAB_0028b00a;
        }
        pcVar5 = "Command line switch \"-O\" should be followed by an integer.\n";
        goto LAB_0028b0ae;
      }
      if (iVar3 == -1) {
        if (local_38->pGia == (Gia_Man_t *)0x0) {
          pcVar5 = "Abc_CommandAbc9BCore(): There is no AIG.\n";
        }
        else {
          if (local_38->pGia->nRegs != 0) {
            if (local_68.pFilePivots != (char *)0x0) {
              pFVar4 = fopen(local_68.pFilePivots,"r");
              if (pFVar4 == (FILE *)0x0) {
                Abc_Print(-1,
                          "Abc_CommandAbc9BCore(): Cannot open file \"%s\" with pivot node IDs.\n",
                          local_68.pFilePivots);
                return 0;
              }
              fclose(pFVar4);
            }
            if (globalUtilOptind + 1 == argc) {
              local_68.pFileProof = argv[globalUtilOptind];
              pFVar4 = fopen(local_68.pFileProof,"wb");
              if (pFVar4 == (FILE *)0x0) {
                Abc_Print(-1,
                          "Abc_CommandAbc9BCore(): Cannot open file \"%s\" for writing the proof.\n"
                          ,local_68.pFileProof);
                return 0;
              }
              fclose(pFVar4);
            }
            Bmc_ManBCorePerform(pAVar2->pGia,&local_68);
            return 0;
          }
          pcVar5 = "Abc_CommandAbc9BCore(): AIG has no registers.\n";
        }
        Abc_Print(-1,pcVar5);
        return 0;
      }
      goto LAB_0028b0bd;
    }
    if (argc <= globalUtilOptind) {
      pcVar5 = "Command line switch \"-F\" should be followed by an integer.\n";
      goto LAB_0028b0ae;
    }
    iVar3 = atoi(argv[globalUtilOptind]);
    local_68.iFrame = iVar3;
LAB_0028b00a:
    globalUtilOptind = iVar1 + 1;
    if (iVar3 < 0) {
LAB_0028b0bd:
      Abc_Print(-2,"usage: &bcore [-FOTV num] [-vh] <file>\n");
      Abc_Print(-2,"\t         records UNSAT core of the BMC instance\n");
      Abc_Print(-2,"\t-F num : the zero-based index of a timeframe [default = %d]\n",
                local_68._0_8_ & 0xffffffff);
      Abc_Print(-2,"\t-O num : the zero-based index of a primary output [default = %d]\n",
                (ulong)local_68._0_8_ >> 0x20);
      Abc_Print(-2,"\t-T num : approximate timeout in seconds [default = %d]\n",
                local_68._8_8_ & 0xffffffff);
      Abc_Print(-2,"\t-V file: file name with AIG IDs of pivot variables [default = no pivots]\n");
      pcVar5 = "yes";
      if (local_68.fVerbose == 0) {
        pcVar5 = "no";
      }
      Abc_Print(-2,"\t-v     : toggle printing verbose information [default = %s]\n",pcVar5);
      Abc_Print(-2,"\t-h     : print the command usage\n");
      Abc_Print(-2,"\t<file> : file name to write the resulting proof [default = stdout]\n");
      return 1;
    }
  }
  if (iVar3 == 0x54) {
    if (globalUtilOptind < argc) {
      iVar3 = atoi(argv[globalUtilOptind]);
      local_68.nTimeOut = iVar3;
      goto LAB_0028b00a;
    }
    pcVar5 = "Command line switch \"-T\" should be followed by an integer.\n";
  }
  else {
    if (iVar3 != 0x56) {
      if (iVar3 != 0x76) goto LAB_0028b0bd;
      local_68._32_8_ = local_68._32_8_ ^ 1;
      goto LAB_0028af7e;
    }
    if (globalUtilOptind < argc) {
      local_68.pFilePivots = argv[globalUtilOptind];
      globalUtilOptind = globalUtilOptind + 1;
      goto LAB_0028af7e;
    }
  }
LAB_0028b0ae:
  Abc_Print(-1,pcVar5);
  goto LAB_0028b0bd;
}

Assistant:

int Abc_CommandAbc9BCore( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    int c;
    Bmc_BCorePar_t Pars, * pPars = &Pars;
    memset( pPars, 0, sizeof(Bmc_BCorePar_t) );
    pPars->iFrame        =   10;  // timeframe
    pPars->iOutput       =    0;  // property output
    pPars->nTimeOut      =    0;  // timeout in seconds
    pPars->pFilePivots   = NULL;  // file name with AIG IDs of pivot objects
    pPars->pFileProof    = NULL;  // file name to write the resulting proof
    pPars->fVerbose      =    0;  // verbose output
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "FOTVvh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'F':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-F\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->iFrame = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->iFrame < 0 )
                goto usage;
            break;
        case 'O':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-O\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->iOutput = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->iOutput < 0 )
                goto usage;
            break;
        case 'T':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-T\" should be followed by an integer.\n" );
                goto usage;
            }
            pPars->nTimeOut = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( pPars->nTimeOut < 0 )
                goto usage;
            break;
        case 'V':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-V\" should be followed by a file name.\n" );
                goto usage;
            }
            pPars->pFilePivots = argv[globalUtilOptind];
            globalUtilOptind++;
            break;
        case 'v':
            pPars->fVerbose ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }
    if ( pAbc->pGia == NULL )
    {
        Abc_Print( -1, "Abc_CommandAbc9BCore(): There is no AIG.\n" );
        return 0;
    }
    if ( Gia_ManRegNum(pAbc->pGia) == 0 )
    {
        Abc_Print( -1, "Abc_CommandAbc9BCore(): AIG has no registers.\n" );
        return 0;
    }
    // get the file name
    if ( pPars->pFilePivots != NULL )
    {
        FILE * pFile;
        pFile = fopen( pPars->pFilePivots, "r" );
        if ( pFile == NULL )
        {
            Abc_Print( -1, "Abc_CommandAbc9BCore(): Cannot open file \"%s\" with pivot node IDs.\n", pPars->pFilePivots );
            return 0;
        }
        fclose( pFile );
    }
    // get the file name
    if ( argc == globalUtilOptind + 1 )
    {
        FILE * pFile;
        pPars->pFileProof = argv[globalUtilOptind];
        pFile = fopen( pPars->pFileProof, "wb" );
        if ( pFile == NULL )
        {
            Abc_Print( -1, "Abc_CommandAbc9BCore(): Cannot open file \"%s\" for writing the proof.\n", pPars->pFileProof );
            return 0;
        }
        fclose( pFile );
    }
    Bmc_ManBCorePerform( pAbc->pGia, pPars );
    return 0;

usage:
    Abc_Print( -2, "usage: &bcore [-FOTV num] [-vh] <file>\n" );
    Abc_Print( -2, "\t         records UNSAT core of the BMC instance\n" );
    Abc_Print( -2, "\t-F num : the zero-based index of a timeframe [default = %d]\n",         pPars->iFrame );
    Abc_Print( -2, "\t-O num : the zero-based index of a primary output [default = %d]\n",    pPars->iOutput );
    Abc_Print( -2, "\t-T num : approximate timeout in seconds [default = %d]\n",              pPars->nTimeOut );
    Abc_Print( -2, "\t-V file: file name with AIG IDs of pivot variables [default = no pivots]\n" );
    Abc_Print( -2, "\t-v     : toggle printing verbose information [default = %s]\n",         pPars->fVerbose?     "yes": "no" );
    Abc_Print( -2, "\t-h     : print the command usage\n");
    Abc_Print( -2, "\t<file> : file name to write the resulting proof [default = stdout]\n");
    return 1;
}